

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Vector2 Vector2MoveTowards(Vector2 v,Vector2 target,float maxDistance)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float dist;
  float value;
  float dy;
  float dx;
  float maxDistance_local;
  Vector2 target_local;
  Vector2 v_local;
  Vector2 result;
  
  memset(&v_local,0,8);
  dx = target.x;
  target_local.x = v.x;
  fVar1 = dx - target_local.x;
  maxDistance_local = target.y;
  target_local.y = v.y;
  fVar2 = maxDistance_local - target_local.y;
  fVar3 = fVar1 * fVar1 + fVar2 * fVar2;
  if (((fVar3 == 0.0) && (!NAN(fVar3))) ||
     ((0.0 <= maxDistance && (fVar3 <= maxDistance * maxDistance)))) {
    v_local = target;
  }
  fVar3 = sqrtf(fVar3);
  v_local.y = (fVar2 / fVar3) * maxDistance + target_local.y;
  v_local.x = (fVar1 / fVar3) * maxDistance + target_local.x;
  return v_local;
}

Assistant:

RMDEF Vector2 Vector2MoveTowards(Vector2 v, Vector2 target, float maxDistance)
{
    Vector2 result = { 0 };
    float dx = target.x - v.x;
    float dy = target.y - v.y;
    float value = (dx*dx) + (dy*dy);

    if ((value == 0) || ((maxDistance >= 0) && (value <= maxDistance*maxDistance))) result = target;

    float dist = sqrtf(value);

    result.x = v.x + dx/dist*maxDistance;
    result.y = v.y + dy/dist*maxDistance;

    return result;
}